

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

void __thiscall CodeGenerator::writeProperties(CodeGenerator *this,ostream *s,Class *clazz)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pPVar4;
  char *pcVar5;
  undefined1 *puVar6;
  void *this_00;
  string local_a0 [8];
  string name;
  Property i;
  iterator __end1;
  iterator __begin1;
  vector<Property,_std::allocator<Property>_> *__range1;
  Class *clazz_local;
  ostream *s_local;
  CodeGenerator *this_local;
  
  poVar3 = std::operator<<(s,"    // properties");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Property,_std::allocator<Property>_>::begin(&clazz->properties);
  i.type.field_2._8_8_ = std::vector<Property,_std::allocator<Property>_>::end(&clazz->properties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                                *)((long)&i.type.field_2 + 8));
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::
             __normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
             operator*(&__end1);
    Property::Property((Property *)((long)&name.field_2 + 8),pPVar4);
    std::__cxx11::string::string(local_a0,(string *)&i);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a0);
    iVar2 = toupper((int)*pcVar5);
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_a0);
    *puVar6 = (char)iVar2;
    poVar3 = std::operator<<(s,"    static rengine::Signal<> on");
    poVar3 = std::operator<<(poVar3,local_a0);
    poVar3 = std::operator<<(poVar3,"Changed;");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    const ");
    poVar3 = std::operator<<(poVar3,(string *)(i.name.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," &");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3,"() const {");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        return m_");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    }");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    void set");
    poVar3 = std::operator<<(poVar3,local_a0);
    poVar3 = std::operator<<(poVar3,"(const ");
    poVar3 = std::operator<<(poVar3,(string *)(i.name.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," &");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3,") {");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        if (m_");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3," == ");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3,")");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"            return;");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        m_");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        on");
    poVar3 = std::operator<<(poVar3,local_a0);
    poVar3 = std::operator<<(poVar3,"Changed.emit(this);");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    }");
    this_00 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a0);
    Property::~Property((Property *)((long)&name.field_2 + 8));
    __gnu_cxx::__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void CodeGenerator::writeProperties(std::ostream &s, Class *clazz)
{
    s << "    // properties" << std::endl;
    for (auto i : clazz->properties) {
        std::string name = i.name;
        name[0] = std::toupper(name[0]);
        s << "    static rengine::Signal<> on" << name << "Changed;" << std::endl
          << "    const " << i.type << " &" << i.name << "() const {" << std::endl
          << "        return m_" << i.name << ";" << std::endl
          << "    }" << std::endl
          << "    void set" << name << "(const " << i.type << " &" << i.name << ") {" << std::endl
          << "        if (m_" << i.name << " == " << i.name << ")" << std::endl
          << "            return;" << std::endl
          << "        m_" << i.name << " = " << i.name << ";" << std::endl
          << "        on" << name << "Changed.emit(this);" << std::endl
          << "    }" << std::endl
          << std::endl;
    }
}